

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::matrixCompMult<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  long lVar1;
  Matrix<float,_2,_2> *retVal;
  int c;
  MatrixCaseUtils *pMVar2;
  int col;
  long lVar3;
  bool bVar4;
  Vector<float,_2> VVar5;
  Matrix<float,_2,_2> MVar6;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  pMVar2 = this;
  do {
    lVar3 = 0;
    do {
      VVar5.m_data[0] = 1.0;
      VVar5.m_data[1] = 0.0;
      if (lVar1 != lVar3) {
        VVar5.m_data[0] = 0.0;
        VVar5.m_data[1] = 0.0;
      }
      *(float *)(pMVar2 + lVar3 * 8) = VVar5.m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pMVar2 = pMVar2 + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  lVar1 = 0;
  do {
    lVar3 = 0;
    do {
      MVar6.m_data.m_data[0].m_data[0] =
           *(float *)((long)a + lVar3 * 2 * 4) * *(float *)((long)b + lVar3 * 2 * 4);
      *(float *)(this + lVar3 * 8) = MVar6.m_data.m_data[0].m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    a = (Matrix<float,_2,_2> *)((long)a + 4);
    b = (Matrix<float,_2,_2> *)((long)b + 4);
    this = this + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  MVar6.m_data.m_data[0].m_data[1] = 0.0;
  MVar6.m_data.m_data[1].m_data[0] = VVar5.m_data[0];
  MVar6.m_data.m_data[1].m_data[1] = VVar5.m_data[1];
  return (Matrix<float,_2,_2>)MVar6.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}